

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabox.hpp
# Opt level: O3

AABox * operator+(AABox *__return_storage_ptr__,AABox *a,AABox *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = a->x1;
  fVar2 = b->x1;
  fVar3 = fVar2;
  if (fVar1 <= fVar2) {
    fVar3 = fVar1;
  }
  __return_storage_ptr__->x1 =
       (float)(~-(uint)NAN(fVar1) & (uint)fVar3 | -(uint)NAN(fVar1) & (uint)fVar2);
  fVar1 = a->x2;
  fVar2 = b->x2;
  fVar3 = fVar2;
  if (fVar2 <= fVar1) {
    fVar3 = fVar1;
  }
  __return_storage_ptr__->x2 =
       (float)(~-(uint)NAN(fVar1) & (uint)fVar3 | -(uint)NAN(fVar1) & (uint)fVar2);
  fVar1 = a->y1;
  fVar2 = b->y1;
  fVar3 = fVar2;
  if (fVar1 <= fVar2) {
    fVar3 = fVar1;
  }
  __return_storage_ptr__->y1 =
       (float)(~-(uint)NAN(fVar1) & (uint)fVar3 | -(uint)NAN(fVar1) & (uint)fVar2);
  fVar1 = a->y2;
  fVar2 = b->y2;
  fVar3 = fVar2;
  if (fVar2 <= fVar1) {
    fVar3 = fVar1;
  }
  __return_storage_ptr__->y2 =
       (float)(~-(uint)NAN(fVar1) & (uint)fVar3 | -(uint)NAN(fVar1) & (uint)fVar2);
  fVar1 = a->z1;
  fVar2 = b->z1;
  fVar3 = fVar2;
  if (fVar1 <= fVar2) {
    fVar3 = fVar1;
  }
  __return_storage_ptr__->z1 =
       (float)(~-(uint)NAN(fVar1) & (uint)fVar3 | -(uint)NAN(fVar1) & (uint)fVar2);
  fVar1 = a->z2;
  fVar2 = b->z2;
  fVar3 = fVar2;
  if (fVar2 <= fVar1) {
    fVar3 = fVar1;
  }
  __return_storage_ptr__->z2 =
       (float)(~-(uint)NAN(fVar1) & (uint)fVar3 | -(uint)NAN(fVar1) & (uint)fVar2);
  return __return_storage_ptr__;
}

Assistant:

AABox operator+ (const AABox& a, const AABox& b) {
	AABox t;
	t.x1 = fmin(a.x1, b.x1);
	t.x2 = fmax(a.x2, b.x2);
	t.y1 = fmin(a.y1, b.y1);
	t.y2 = fmax(a.y2, b.y2);
	t.z1 = fmin(a.z1, b.z1);
	t.z2 = fmax(a.z2, b.z2);
	return t;
}